

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvidiamon.cpp
# Opt level: O3

void __thiscall nvidiamon::get_hardware_info(nvidiamon *this,json *hw_json)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  char cVar4;
  char cVar5;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar6;
  reference pvVar7;
  long *plVar8;
  uint uVar9;
  size_type *psVar10;
  ulong uVar11;
  uint __val;
  pointer __rhs;
  long lVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string gpu_number;
  uint total_mem;
  uint sm_freq;
  string __str;
  string name;
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cmd_result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  istringstream instr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  data local_308;
  data local_2f8;
  nvidiamon *local_2e8;
  int local_2e0;
  uint local_2dc;
  data local_2d8;
  char *local_2c8;
  uint local_2c0;
  char local_2b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  MessageBase *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  key_type local_278;
  key_type local_258;
  key_type local_238;
  pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  data local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [40];
  ios_base local_138 [264];
  
  local_1f8.m_type = null;
  local_1f8._1_7_ = 0;
  local_1f8.m_value.object = (object_t *)0x0;
  local_2e8 = this;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)6>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_1f8,(ulong)this->ngpus);
  pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)hw_json,"HW");
  pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(pbVar6,"gpu");
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>(pbVar6,"nGPU");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_1f8.m_type;
  local_1f8.m_type = vVar2;
  jVar3 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value = local_1f8.m_value;
  local_1f8.m_value = jVar3;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_1f8);
  paVar1 = &local_1b0.field_2;
  local_1b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"nvidia-smi","");
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"--query-gpu=clocks.max.sm,memory.total,gpu_name","");
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_170,"--format=csv,noheader,nounits","");
  __l._M_len = 3;
  __l._M_array = &local_1b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1c8,__l,(allocator_type *)&local_218);
  lVar12 = 0;
  do {
    if (local_160 + lVar12 != *(undefined1 **)((long)local_170 + lVar12)) {
      operator_delete(*(undefined1 **)((long)local_170 + lVar12));
    }
    lVar12 = lVar12 + -0x20;
  } while (lVar12 != -0x60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e0,&local_1c8);
  prmon::cmd_pipe_output(&local_218,&local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e0);
  if (local_218.first == 0) {
    local_280 = local_218.second.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (local_218.second.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_218.second.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_288 = &local_2e8->super_MessageBase;
      __val = 0;
      __rhs = local_218.second.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_1b0,(string *)__rhs,_S_in);
        std::istream::_M_extract<unsigned_int>((uint *)&local_1b0);
        std::istream::get();
        std::istream::_M_extract<unsigned_int>((uint *)&local_1b0);
        lVar12 = std::istream::tellg();
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"unknown","");
        if (lVar12 + 2U <= __rhs->_M_string_length) {
          std::__cxx11::string::substr((ulong)&local_328,(ulong)__rhs);
          std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_328);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p);
          }
        }
        if ((*(byte *)((long)local_190 + *(long *)(local_1b0._M_dataplus._M_p + -0x18)) & 5) == 0) {
          cVar5 = '\x01';
          if (9 < __val) {
            uVar11 = (ulong)__val;
            cVar4 = '\x04';
            do {
              cVar5 = cVar4;
              uVar9 = (uint)uVar11;
              if (uVar9 < 100) {
                cVar5 = cVar5 + -2;
                goto LAB_0019158a;
              }
              if (uVar9 < 1000) {
                cVar5 = cVar5 + -1;
                goto LAB_0019158a;
              }
              if (uVar9 < 10000) goto LAB_0019158a;
              uVar11 = uVar11 / 10000;
              cVar4 = cVar5 + '\x04';
            } while (99999 < uVar9);
            cVar5 = cVar5 + '\x01';
          }
LAB_0019158a:
          local_2c8 = local_2b8;
          std::__cxx11::string::_M_construct((ulong)&local_2c8,cVar5);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_2c8,local_2c0,__val);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,0x198d3f);
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_328.field_2._M_allocated_capacity = *psVar10;
            local_328.field_2._8_8_ = plVar8[3];
          }
          else {
            local_328.field_2._M_allocated_capacity = *psVar10;
            local_328._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_328._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if (local_2c8 != local_2b8) {
            operator_delete(local_2c8);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_2d8,&local_2a8);
          pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)hw_json,"HW");
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar6,"gpu");
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,local_328._M_dataplus._M_p,
                     local_328._M_dataplus._M_p + local_328._M_string_length);
          pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[](pvVar7,&local_238);
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar6,"name");
          vVar2 = (pvVar7->m_data).m_type;
          (pvVar7->m_data).m_type = local_2d8.m_type;
          jVar3 = (pvVar7->m_data).m_value;
          (pvVar7->m_data).m_value = local_2d8.m_value;
          local_2d8.m_type = vVar2;
          local_2d8.m_value = jVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_2d8);
          local_2f8.m_type = null;
          local_2f8._1_7_ = 0;
          local_2f8.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)6>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_2f8,(ulong)local_2dc);
          pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)hw_json,"HW");
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar6,"gpu");
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_328._M_dataplus._M_p,
                     local_328._M_dataplus._M_p + local_328._M_string_length);
          pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[](pvVar7,&local_258);
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar6,"sm_freq");
          vVar2 = (pvVar7->m_data).m_type;
          (pvVar7->m_data).m_type = local_2f8.m_type;
          local_2f8.m_type = vVar2;
          jVar3 = (pvVar7->m_data).m_value;
          (pvVar7->m_data).m_value = local_2f8.m_value;
          local_2f8.m_value = jVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_2f8);
          local_308.m_type = null;
          local_308._1_7_ = 0;
          local_308.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)6>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_308,(ulong)(local_2e8->MB_to_KB * local_2e0));
          pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  *)hw_json,"HW");
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar6,"gpu");
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,local_328._M_dataplus._M_p,
                     local_328._M_dataplus._M_p + local_328._M_string_length);
          pbVar6 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[](pvVar7,&local_278);
          pvVar7 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>(pbVar6,"total_mem");
          vVar2 = (pvVar7->m_data).m_type;
          (pvVar7->m_data).m_type = local_308.m_type;
          local_308.m_type = vVar2;
          jVar3 = (pvVar7->m_data).m_value;
          (pvVar7->m_data).m_value = local_308.m_value;
          local_308.m_value = jVar3;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_308);
        }
        else {
          std::operator+(&local_328,"Unexpected line from GPU hardware query: ",__rhs);
          MessageBase::warning(local_288,&local_328);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        __val = __val + 1;
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
        std::ios_base::~ios_base(local_138);
        __rhs = __rhs + 1;
      } while (__rhs != local_280);
    }
  }
  else {
    local_1b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b0,"Failed to get hardware details for GPUs","");
    MessageBase::error(&local_2e8->super_MessageBase,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218.second);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return;
}

Assistant:

void const nvidiamon::get_hardware_info(nlohmann::json& hw_json) {
  // Record the number of GPUs
  hw_json["HW"]["gpu"]["nGPU"] = nvidiamon::ngpus;

  // For the GPUs present we get details using "nvidia-smi --query-gpu="
  // Note that the name is put at the end of the output as it makes
  // parsing easier
  std::vector<std::string> cmd = {
      "nvidia-smi", "--query-gpu=clocks.max.sm,memory.total,gpu_name",
      "--format=csv,noheader,nounits"};
  auto cmd_result = prmon::cmd_pipe_output(cmd);
  if (cmd_result.first) {
    error("Failed to get hardware details for GPUs");
    return;
  }
  unsigned int sm_freq, total_mem;
  unsigned int count{0};
  for (auto const& s : cmd_result.second) {
    std::istringstream instr(s);
    instr >> sm_freq;
    instr.get();  // Swallow the comma
    instr >> total_mem;
    auto pos = std::string::size_type(instr.tellg()) + 2;  // Skip ", "
    std::string name{"unknown"};
    if (pos <= s.size()) {  // This should never fail, but...
      name = s.substr(pos);
    }
    if (!(instr.fail() || instr.bad())) {
      std::string gpu_number = "gpu_" + std::to_string(count);
      hw_json["HW"]["gpu"][gpu_number]["name"] = name;
      hw_json["HW"]["gpu"][gpu_number]["sm_freq"] = sm_freq;
      hw_json["HW"]["gpu"][gpu_number]["total_mem"] = total_mem * MB_to_KB;
    } else {
      warning("Unexpected line from GPU hardware query: " + s);
    }
    ++count;
  }
  return;
}